

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validate(Validator *this,Reader *structNode,uint64_t scopeId)

{
  char *pcVar1;
  ListElementCount LVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  bool *__s;
  unsigned_short *puVar7;
  ulong uVar8;
  uint dataWordCount;
  byte bVar9;
  bool bVar10;
  ushort uVar11;
  uint uVar12;
  uint64_t id;
  bool *__s_00;
  Fault FVar13;
  ElementCount index;
  ulong uVar14;
  bool fieldIsPointer;
  Reader *local_268;
  uint nonDiscriminantPos;
  uint nextOrdinal;
  uint discriminantPos;
  uint dataSizeInBits;
  Fault f;
  Validator *local_248;
  ushort *local_240;
  WirePointer *local_238;
  uint local_230;
  ushort local_22c;
  int local_228;
  uint pointerCount;
  ulong local_218;
  uint fieldBits;
  DebugComparison<unsigned_short,_int> _kjCondition;
  Fault f_3;
  Validator *local_1b0;
  Array<bool> sawDiscriminantValue_heap;
  Array<bool> sawCodeOrder_heap;
  uint64_t scopeId_local;
  int local_140;
  ElementCount local_13c;
  bool *local_138;
  bool *local_130;
  bool _kjCondition_7;
  undefined7 uStack_127;
  Validator *local_120;
  WirePointer *local_118;
  int local_110;
  bool _kjCondition_3;
  undefined1 auStack_107 [15];
  Validator *pVStack_100;
  WirePointer *local_f8;
  int local_f0;
  Validator *local_d8;
  Validator *local_d0;
  ulong local_c8;
  Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
  *local_c0;
  size_t local_b8;
  anon_class_8_1_a7e8901a _kjContextFunc341;
  Reader fields;
  bool sawDiscriminantValue_stack [32];
  bool sawCodeOrder_stack [32];
  
  uVar12 = (structNode->_reader).dataSize;
  pointerCount = 0;
  dataSizeInBits = 0;
  if (0x7f < uVar12) {
    dataSizeInBits = (uint)*(ushort *)((long)(structNode->_reader).data + 0xe) << 6;
  }
  if (0xcf < uVar12) {
    pointerCount = (uint)*(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if ((structNode->_reader).pointerCount < 4) {
    iVar5 = 0x7fffffff;
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition.op.content.size_ = 0;
    _kjCondition._0_8_ = (SegmentReader *)0x0;
  }
  else {
    _kjCondition._0_8_ = (structNode->_reader).segment;
    _kjCondition.op.content.ptr = (char *)(structNode->_reader).capTable;
    _kjCondition.op.content.size_ = (size_t)((structNode->_reader).pointers + 3);
    iVar5 = (structNode->_reader).nestingLimit;
  }
  _kjCondition._24_4_ = iVar5;
  local_268 = structNode;
  scopeId_local = scopeId;
  capnp::_::PointerReader::getList
            (&fields.reader,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
  LVar2 = fields.reader.elementCount;
  uVar8 = (ulong)fields.reader.elementCount;
  if (uVar8 < 0x21) {
    sawCodeOrder_heap.ptr = (bool *)0x0;
    sawCodeOrder_heap.size_ = 0;
    sawCodeOrder_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    sawCodeOrder_heap.ptr =
         (bool *)kj::_::HeapArrayDisposer::allocateImpl
                           (1,uVar8,uVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    sawCodeOrder_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawCodeOrder_heap.size_ = uVar8;
  }
  __s_00 = sawCodeOrder_heap.ptr;
  uVar14 = sawCodeOrder_heap.size_;
  if (LVar2 < 0x21) {
    __s_00 = sawCodeOrder_stack;
    uVar14 = uVar8;
  }
  uVar11 = 0;
  memset(__s_00,0,uVar14);
  if (0xff < (local_268->_reader).dataSize) {
    uVar11 = *(ushort *)((long)(local_268->_reader).data + 0x1e);
  }
  uVar8 = (ulong)uVar11;
  if (uVar11 < 0x21) {
    sawDiscriminantValue_heap.ptr = (bool *)0x0;
    sawDiscriminantValue_heap.size_ = 0;
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)0x0;
    __s = sawDiscriminantValue_stack;
  }
  else {
    __s = (bool *)kj::_::HeapArrayDisposer::allocateImpl
                            (1,uVar8,uVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    sawDiscriminantValue_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    sawDiscriminantValue_heap.size_ = uVar8;
    sawDiscriminantValue_heap.ptr = __s;
  }
  local_b8 = uVar14;
  memset(__s,0,uVar8);
  uVar12 = (local_268->_reader).dataSize;
  if ((0xff < uVar12) && (*(short *)((long)(local_268->_reader).data + 0x1e) != 0)) {
    if (uVar12 < 0x100) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(unsigned_short *)((long)(local_268->_reader).data + 0x1e);
    }
    _kjCondition.left = uVar3;
    _kjCondition.right = 1;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = uVar3 != 1;
    if (uVar3 == 1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,int>&,char_const(&)[37]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x146,FAILED,"structNode.getDiscriminantCount() != 1",
                 "_kjCondition,\"union must have at least two members\"",&_kjCondition,
                 (char (*) [37])"union must have at least two members");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      goto LAB_0038c349;
    }
    if ((local_268->_reader).dataSize < 0x100) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)((long)(local_268->_reader).data + 0x1e);
    }
    _kjCondition.left = uVar11;
    _kjCondition.right = fields.reader.elementCount;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = fields.reader.elementCount >= uVar11;
    if (fields.reader.elementCount < uVar11) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int>&,char_const(&)[54]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x148,FAILED,"structNode.getDiscriminantCount() <= fields.size()",
                 "_kjCondition,\"struct can\'t have more union fields than total fields\"",
                 (DebugComparison<unsigned_short,_unsigned_int> *)&_kjCondition,
                 (char (*) [54])"struct can\'t have more union fields than total fields");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      goto LAB_0038c349;
    }
    _kjCondition._0_4_ = 0x10;
    if (0x11f < (local_268->_reader).dataSize) {
      _kjCondition._0_4_ = *(int *)((long)(local_268->_reader).data + 0x20) * 0x10 + 0x10;
    }
    _kjCondition.op.content.ptr = (char *)&dataSizeInBits;
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_5b2391;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if (dataSizeInBits < (uint)_kjCondition._0_4_) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int&>&,char_const(&)[36]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x14b,FAILED,"(structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits",
                 "_kjCondition,\"union discriminant is out-of-bounds\"",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)&_kjCondition,
                 (char (*) [36])"union discriminant is out-of-bounds");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      goto LAB_0038c349;
    }
  }
  uVar14 = (ulong)fields.reader.elementCount;
  uVar12 = 0;
  local_138 = __s;
  local_c8 = uVar8;
  puVar7 = (unsigned_short *)kj::Arena::allocateBytes(&this->loader->arena,uVar14 * 2,2,false);
  (this->membersByDiscriminant).ptr = puVar7;
  (this->membersByDiscriminant).size_ = uVar14;
  discriminantPos = 0;
  if (0xff < (local_268->_reader).dataSize) {
    uVar12 = (uint)*(ushort *)((long)(local_268->_reader).data + 0x1e);
  }
  nextOrdinal = 0;
  local_13c = fields.reader.elementCount;
  nonDiscriminantPos = uVar12;
  if (fields.reader.elementCount != 0) {
    local_c0 = (Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
                *)&this->members;
    local_218 = 0;
    index = 0;
    local_130 = __s_00;
    local_d8 = this;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)&f,&fields.reader,index);
      _kjContextFunc341.field = (Reader *)&f;
      kj::_::Debug::Context::Context((Context *)&_kjCondition);
      _kjCondition._0_8_ = &PTR__Context_006ffb00;
      local_1b0 = local_248;
      f_3 = f;
      if (local_22c == 0) {
        local_1b0 = (Validator *)0x0;
        f_3.exception = (Exception *)0x0;
      }
      _f_3 = (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&f_3,(void *)0x0,0);
      _fieldBits = (anon_class_16_2_3f8e8a0c *)&_kjCondition_7;
      __kjCondition_7 = (Exception *)&_kjCondition_3;
      local_120 = this;
      __kjCondition_3 = _f_3;
      kj::
      Table<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>>
      ::
      upsert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::upsert<capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_>(capnp::Text::Reader,unsigned_int,capnp::SchemaLoader::Validator::validateMemberName(kj::StringPtr,unsigned_int)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&,kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry&&)_1_>
                (local_c0,(Entry *)&f_3,(anon_class_8_1_6f242a07 *)&fieldBits);
      FVar13 = f;
      if (local_230 < 0x10) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)*local_240;
      }
      if (uVar8 < local_b8) {
        if (local_230 < 0x10) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*local_240;
        }
        bVar9 = __s_00[uVar8] ^ 1;
      }
      else {
        bVar9 = 0;
      }
      _kjCondition_3 = (bool)bVar9;
      if (bVar9 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[18]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x15a,FAILED,
                   "field.getCodeOrder() < sawCodeOrder.size() && !sawCodeOrder[field.getCodeOrder()]"
                   ,"_kjCondition,\"invalid codeOrder\"",(bool *)&_kjCondition_3,
                   (char (*) [18])"invalid codeOrder");
        this->isValid = false;
        kj::_::Debug::Fault::~Fault(&f_3);
LAB_0038bf1a:
        bVar10 = false;
      }
      else {
        if (local_230 < 0x10) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*local_240;
        }
        __s_00[uVar8] = true;
        if ((0x5f < local_230) && (local_240[5] == 1)) {
          if (local_230 < 0x70) {
            uVar11 = 0;
          }
          else {
            uVar11 = local_240[6];
          }
          f_3.exception._0_2_ = uVar11;
          local_1b0 = (Validator *)&nextOrdinal;
          if (uVar11 < nextOrdinal) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_int&>&,char_const(&)[35]>
                      ((Fault *)&_kjCondition_3,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                       ,0x160,FAILED,"ordinal.getExplicit() >= nextOrdinal",
                       "_kjCondition,\"fields were not ordered by ordinal\"",
                       (DebugComparison<unsigned_short,_unsigned_int_&> *)&f_3,
                       (char (*) [35])"fields were not ordered by ordinal");
            this->isValid = false;
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
            goto LAB_0038bf1a;
          }
          nextOrdinal = 1;
          if (0x6f < local_230) {
            nextOrdinal = local_240[6] + 1;
          }
        }
        if ((local_230 < 0x20) || (local_240[1] == 0)) {
          local_1b0._0_4_ = fields.reader.elementCount;
          f_3.exception = (Exception *)&nonDiscriminantPos;
          if (nonDiscriminantPos <= fields.reader.elementCount) {
            uVar4 = nonDiscriminantPos;
            nonDiscriminantPos = nonDiscriminantPos + 1;
            goto LAB_0038be35;
          }
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[39]>
                    ((Fault *)&_kjCondition_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x16d,FAILED,"nonDiscriminantPos <= fields.size()",
                     "_kjCondition,\"discriminantCount did not match fields\"",
                     (DebugComparison<unsigned_int_&,_unsigned_int> *)&f_3,
                     (char (*) [39])"discriminantCount did not match fields");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_3);
          goto LAB_0038bf1a;
        }
        uVar8 = 0xffff;
        if (0x1f < local_230) {
          uVar8 = (ulong)local_240[1] ^ 0xffff;
        }
        if (uVar8 < local_c8) {
          uVar8 = 0xffff;
          if (0x1f < local_230) {
            uVar8 = (ulong)local_240[1] ^ 0xffff;
          }
          _kjCondition_3 = (bool)(local_138[uVar8] ^ 1);
        }
        else {
          _kjCondition_3 = false;
        }
        if (_kjCondition_3 == false) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[26]>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x167,FAILED,
                     "field.getDiscriminantValue() < sawDiscriminantValue.size() && !sawDiscriminantValue[field.getDiscriminantValue()]"
                     ,"_kjCondition,\"invalid discriminantValue\"",&_kjCondition_3,
                     (char (*) [26])"invalid discriminantValue");
          this->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
          goto LAB_0038bf1a;
        }
        uVar8 = 0xffff;
        if (0x1f < local_230) {
          uVar8 = (ulong)local_240[1] ^ 0xffff;
        }
        local_138[uVar8] = true;
        uVar4 = discriminantPos;
        discriminantPos = discriminantPos + 1;
LAB_0038be35:
        (this->membersByDiscriminant).ptr[uVar4] = (unsigned_short)local_218;
        if (local_230 < 0x50) {
          uVar11 = 0;
        }
        else {
          uVar11 = local_240[4];
        }
        if (uVar11 == 1) {
          if (local_230 < 0xc0) {
            id = 0;
          }
          else {
            id = *(uint64_t *)(local_240 + 8);
          }
          validateTypeId(this,id,STRUCT);
LAB_0038c0d8:
          local_218 = (ulong)((int)local_218 + 1);
          bVar10 = true;
          __s_00 = local_130;
        }
        else {
          if (uVar11 != 0) goto LAB_0038c0d8;
          _fieldBits = _fieldBits & 0xffffffff00000000;
          fieldIsPointer = false;
          local_140 = local_228;
          local_d0 = local_248;
          if (local_22c < 3) {
            local_f0 = 0x7fffffff;
            pVStack_100 = (Validator *)0x0;
            local_f8 = (WirePointer *)0x0;
            __kjCondition_3 = (Exception *)0x0;
          }
          else {
            local_f8 = local_238 + 2;
            pVStack_100 = local_248;
            __kjCondition_3 = f;
            local_f0 = local_228;
          }
          capnp::_::PointerReader::getStruct
                    ((StructReader *)&f_3,(PointerReader *)&_kjCondition_3,(word *)0x0);
          if (local_22c < 4) {
            local_140 = 0x7fffffff;
            local_d0 = (Validator *)0x0;
            local_118 = (WirePointer *)0x0;
            FVar13.exception = (Exception *)0x0;
          }
          else {
            local_118 = local_238 + 3;
          }
          __kjCondition_7 = FVar13.exception;
          local_120 = local_d0;
          local_110 = local_140;
          capnp::_::PointerReader::getStruct
                    ((StructReader *)&_kjCondition_3,(PointerReader *)&_kjCondition_7,(word *)0x0);
          this = local_d8;
          validate(local_d8,(Reader *)&f_3,(Reader *)&_kjCondition_3,&fieldBits,&fieldIsPointer);
          iVar5 = 1;
          if (0x3f < local_230) {
            iVar5 = *(int *)(local_240 + 2) + 1;
          }
          if (dataSizeInBits < iVar5 * fieldBits) {
            bVar10 = false;
          }
          else {
            iVar5 = 1;
            if (0x3f < local_230) {
              iVar5 = *(int *)(local_240 + 2) + 1;
            }
            bVar10 = (uint)fieldIsPointer * iVar5 <= pointerCount;
          }
          __kjCondition_7 = (Exception *)CONCAT71(uStack_127,bVar10);
          if (bVar10 != false) goto LAB_0038c0d8;
          uVar6 = 0;
          if (0x3f < local_230) {
            uVar6 = *(undefined4 *)(local_240 + 2);
          }
          __kjCondition_3 = uVar6;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,bool&,char_const(&)[27],unsigned_int,unsigned_int&,unsigned_int&>
                    (&f_3,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x17b,FAILED,
                     "fieldBits * (slot.getOffset() + 1) <= dataSizeInBits && fieldIsPointer * (slot.getOffset() + 1) <= pointerCount"
                     ,
                     "_kjCondition,\"field offset out-of-bounds\", slot.getOffset(), dataSizeInBits, pointerCount"
                     ,&_kjCondition_7,(char (*) [27])"field offset out-of-bounds",
                     (uint *)&_kjCondition_3,&dataSizeInBits,&pointerCount);
          this->isValid = false;
          kj::_::Debug::Fault::~Fault(&f_3);
          bVar10 = false;
          __s_00 = local_130;
        }
      }
      kj::_::Debug::Context::~Context((Context *)&_kjCondition);
      if (!bVar10) goto LAB_0038c349;
      index = index + 1;
    } while (local_13c != index);
  }
  pcVar1 = _kjCondition.op.content.ptr;
  uVar12 = (local_268->_reader).dataSize;
  if (uVar12 < 0x100) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(ushort *)((long)(local_268->_reader).data + 0x1e);
  }
  _kjCondition._0_8_ = &discriminantPos;
  _kjCondition.op.content.ptr = (char *)CONCAT62(_kjCondition.op.content.ptr._2_6_,uVar11);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (discriminantPos != uVar11) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_short>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18a,FAILED,"discriminantPos == structNode.getDiscriminantCount()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_short> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition._0_8_ = &nonDiscriminantPos;
  _kjCondition.op.content.ptr._4_4_ = SUB84(pcVar1,4);
  _kjCondition.op.content.ptr =
       (char *)CONCAT44(_kjCondition.op.content.ptr._4_4_,fields.reader.elementCount);
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if (nonDiscriminantPos != fields.reader.elementCount) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x18b,FAILED,"nonDiscriminantPos == fields.size()","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((0xe0 < uVar12) && ((*(byte *)((long)(local_268->_reader).data + 0x1c) & 1) != 0)) {
    _kjCondition._0_8_ = &scopeId_local;
    _kjCondition.op.content.ptr = (char *)((ulong)_kjCondition.op.content.ptr._4_4_ << 0x20);
    _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_44bf6;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if (scopeId_local == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[27]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x18e,FAILED,"scopeId != 0","_kjCondition,\"group node missing scopeId\"",
                 (DebugComparison<unsigned_long_&,_int> *)&_kjCondition,
                 (char (*) [27])"group node missing scopeId");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      uVar12 = (local_268->_reader).dataSize;
      uVar4 = 0;
      dataWordCount = 0;
      if (0x7f < uVar12) {
        dataWordCount = (uint)*(ushort *)((long)(local_268->_reader).data + 0xe);
      }
      if (0xcf < uVar12) {
        uVar4 = (uint)*(ushort *)((long)(local_268->_reader).data + 0x18);
      }
      Impl::requireStructSize(this->loader,scopeId_local,dataWordCount,uVar4);
      validateTypeId(this,scopeId_local,STRUCT);
    }
  }
LAB_0038c349:
  if (sawDiscriminantValue_heap.ptr != (bool *)0x0) {
    (**(sawDiscriminantValue_heap.disposer)->_vptr_ArrayDisposer)
              (sawDiscriminantValue_heap.disposer,sawDiscriminantValue_heap.ptr,1,
               sawDiscriminantValue_heap.size_,sawDiscriminantValue_heap.size_,0);
  }
  if (sawCodeOrder_heap.ptr != (bool *)0x0) {
    (**(sawCodeOrder_heap.disposer)->_vptr_ArrayDisposer)
              (sawCodeOrder_heap.disposer,sawCodeOrder_heap.ptr,1,sawCodeOrder_heap.size_,
               sawCodeOrder_heap.size_,0);
  }
  return;
}

Assistant:

void validate(const schema::Node::Struct::Reader& structNode, uint64_t scopeId) {
    uint dataSizeInBits = structNode.getDataWordCount() * 64;
    uint pointerCount = structNode.getPointerCount();

    auto fields = structNode.getFields();

    KJ_STACK_ARRAY(bool, sawCodeOrder, fields.size(), 32, 256);
    memset(sawCodeOrder.begin(), 0, sawCodeOrder.size() * sizeof(sawCodeOrder[0]));

    KJ_STACK_ARRAY(bool, sawDiscriminantValue, structNode.getDiscriminantCount(), 32, 256);
    memset(sawDiscriminantValue.begin(), 0,
           sawDiscriminantValue.size() * sizeof(sawDiscriminantValue[0]));

    if (structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() != 1,
                      "union must have at least two members");
      VALIDATE_SCHEMA(structNode.getDiscriminantCount() <= fields.size(),
                      "struct can't have more union fields than total fields");

      VALIDATE_SCHEMA((structNode.getDiscriminantOffset() + 1) * 16 <= dataSizeInBits,
                      "union discriminant is out-of-bounds");
    }